

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

int64_t google::protobuf::util::TimeUtil::DurationToNanoseconds(Duration *duration)

{
  bool bVar1;
  LogMessage aLStack_18 [16];
  
  bVar1 = IsDurationValid(duration);
  if (bVar1) {
    return (long)(duration->field_0)._impl_.nanos_ +
           (duration->field_0)._impl_.seconds_ * 1000000000;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/time_util.cc"
             ,0x134,0x19,"IsDurationValid(duration)");
  absl::lts_20240722::log_internal::LogMessage::operator<<
            (aLStack_18,(char (*) [39])"Duration is outside of the valid range");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_18)
  ;
}

Assistant:

int64_t TimeUtil::DurationToNanoseconds(const Duration& duration) {
  ABSL_DCHECK(IsDurationValid(duration))
      << "Duration is outside of the valid range";
  return duration.seconds() * kNanosPerSecond + duration.nanos();
}